

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::sectionEnded(XmlReporter *this,SectionStats *sectionStats)

{
  int iVar1;
  XmlWriter *this_00;
  string *name;
  long in_RDI;
  ScopedElement e;
  SectionStats *in_stack_fffffffffffffec8;
  allocator *paVar2;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  string *in_stack_fffffffffffffed8;
  ScopedElement *in_stack_fffffffffffffee0;
  allocator *paVar3;
  string *in_stack_fffffffffffffef0;
  XmlWriter *this_01;
  allocator local_e9;
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [39];
  allocator local_71;
  string local_70 [55];
  
  StreamingReporterBase::sectionEnded
            ((StreamingReporterBase *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             in_stack_fffffffffffffec8);
  iVar1 = *(int *)(in_RDI + 0x220) + -1;
  *(int *)(in_RDI + 0x220) = iVar1;
  if (0 < iVar1) {
    this_00 = (XmlWriter *)(in_RDI + 0x1d8);
    this_01 = (XmlWriter *)&stack0xffffffffffffffc7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffffc8,"OverallResults",(allocator *)this_01);
    XmlWriter::scopedElement(this_00,in_stack_fffffffffffffef0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc7);
    paVar3 = &local_71;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"successes",paVar3);
    XmlWriter::ScopedElement::writeAttribute<unsigned_long>
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
               (unsigned_long *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,"failures",&local_99);
    XmlWriter::ScopedElement::writeAttribute<unsigned_long>
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
               (unsigned_long *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    paVar3 = &local_c1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,"expectedFailures",paVar3);
    XmlWriter::ScopedElement::writeAttribute<unsigned_long>
              ((ScopedElement *)paVar3,in_stack_fffffffffffffed8,
               (unsigned_long *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    name = (string *)
           Ptr<const_Catch::IConfig>::operator->((Ptr<const_Catch::IConfig> *)(in_RDI + 0x10));
    iVar1 = (**(code **)((long)*(IShared *)name + 0x60))();
    if (iVar1 == 1) {
      paVar2 = &local_e9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e8,"durationInSeconds",paVar2);
      XmlWriter::ScopedElement::writeAttribute<double>
                ((ScopedElement *)paVar3,name,(double *)CONCAT44(iVar1,in_stack_fffffffffffffed0));
      std::__cxx11::string::~string(local_e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_e9);
    }
    XmlWriter::endElement(this_01);
    XmlWriter::ScopedElement::~ScopedElement
              ((ScopedElement *)CONCAT44(iVar1,in_stack_fffffffffffffed0));
  }
  return;
}

Assistant:

virtual void sectionEnded( SectionStats const& sectionStats ) CATCH_OVERRIDE {
            StreamingReporterBase::sectionEnded( sectionStats );
            if( --m_sectionDepth > 0 ) {
                XmlWriter::ScopedElement e = m_xml.scopedElement( "OverallResults" );
                e.writeAttribute( "successes", sectionStats.assertions.passed );
                e.writeAttribute( "failures", sectionStats.assertions.failed );
                e.writeAttribute( "expectedFailures", sectionStats.assertions.failedButOk );

                if ( m_config->showDurations() == ShowDurations::Always )
                    e.writeAttribute( "durationInSeconds", sectionStats.durationInSeconds );

                m_xml.endElement();
            }
        }